

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEnableLanguageCommand.h
# Opt level: O0

cmCommand * __thiscall cmEnableLanguageCommand::Clone(cmEnableLanguageCommand *this)

{
  cmCommand *this_00;
  cmEnableLanguageCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmEnableLanguageCommand((cmEnableLanguageCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmEnableLanguageCommand; }